

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxVariant.cpp
# Opt level: O0

void __thiscall Jinx::Variant::SetString(Variant *this,WString *value)

{
  String local_38;
  WString *local_18;
  WString *value_local;
  Variant *this_local;
  
  local_18 = value;
  value_local = (WString *)this;
  Impl::ConvertWStringToUtf8(&local_38,value);
  SetString(this,&local_38);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
            (&local_38);
  return;
}

Assistant:

inline_t void Variant::SetString(const WString & value)
	{
		SetString(Impl::ConvertWStringToUtf8(value));
	}